

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.h
# Opt level: O2

void __thiscall SuffixTree::Node::Node(Node *this,Node *parent_,Node *suffix_link_)

{
  this->parent = parent_;
  this->suffix_link = suffix_link_;
  this->lca_class = this;
  this->dsu_parent = this;
  this->num_leaves = 0;
  this->num_lca = 0;
  (this->edges)._M_h._M_buckets = &(this->edges)._M_h._M_single_bucket;
  (this->edges)._M_h._M_bucket_count = 1;
  (this->edges)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->edges)._M_h._M_element_count = 0;
  (this->edges)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->edges)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->edges)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Node (Node *parent_, Node *suffix_link_) :
        parent (parent_),
        suffix_link (suffix_link_),
        lca_class (this),
        dsu_parent (this),
        num_leaves (0),
        num_lca (0)
    {}